

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2/include/catch2/catch.2.13.10.hpp:9743:35)>
::setValue(BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2_include_catch2_catch_2_13_10_hpp:9743:35)>
           *this,string *arg)

{
  ParserResult *in_RDI;
  string *in_stack_00000050;
  anon_class_8_1_50637480_for_m_lambda *in_stack_00000058;
  
  invokeLambda<std::__cxx11::string,Catch::makeCommandLineParser(Catch::ConfigData&)::__7>
            (in_stack_00000058,in_stack_00000050);
  return in_RDI;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }